

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

QSize __thiscall QGridLayout::sizeHint(QGridLayout *this)

{
  QGridLayoutPrivate *this_00;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QGridLayoutPrivate *d;
  int bottom;
  int right;
  int top;
  int left;
  QSize result;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QGridLayoutPrivate *this_01;
  int local_20 [4];
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGridLayout *)0x334f4a);
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = this_00;
  horizontalSpacing((QGridLayout *)this_00);
  verticalSpacing((QGridLayout *)this_01);
  local_10 = QGridLayoutPrivate::sizeHint
                       ((QGridLayoutPrivate *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0,0x334f90);
  local_20[3] = 0xaaaaaaaa;
  local_20[2] = 0xaaaaaaaa;
  local_20[1] = 0xaaaaaaaa;
  local_20[0] = -0x55555556;
  QGridLayoutPrivate::effectiveMargins(this_00,local_20 + 3,local_20 + 2,local_20 + 1,local_20);
  QSize::QSize(in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  QSize::operator+=(in_RDI,(QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QGridLayout::sizeHint() const
{
    Q_D(const QGridLayout);
    QSize result(d->sizeHint(horizontalSpacing(), verticalSpacing()));
    int left, top, right, bottom;
    d->effectiveMargins(&left, &top, &right, &bottom);
    result += QSize(left + right, top + bottom);
    return result;
}